

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_add_order_mpid *m)

{
  undefined1 auVar1 [48];
  side_type sVar2;
  iterator iVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  uint64_t timestamp;
  long lVar7;
  order_book *this_00;
  long lVar8;
  uint64_t order_book_id;
  undefined7 uStack_87;
  key_type local_78;
  undefined1 local_70 [64];
  
  local_78 = 0;
  lVar5 = 0;
  while (m->OrderBook[lVar5] == ' ') {
    lVar5 = lVar5 + 1;
    if (lVar5 == 6) goto LAB_001189b4;
  }
  local_78 = 0;
  for (; lVar5 != 6; lVar5 = lVar5 + 1) {
    local_78 = ((long)m->OrderBook[lVar5] + local_78 * 10) - 0x30;
  }
LAB_001189b4:
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_book_id_map)._M_h,&local_78);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
      _M_cur == (__node_type *)0x0) {
    return;
  }
  this_00 = (order_book *)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>
                   ._M_cur + 0x10);
  lVar5 = 1;
  lVar8 = 0;
  while (m->OrderReferenceNumber[lVar5 + -1] == ' ') {
    lVar5 = lVar5 + 1;
    if (lVar5 == 10) goto LAB_001189f2;
  }
  lVar8 = 0;
  for (; lVar5 != 10; lVar5 = lVar5 + 1) {
    lVar8 = (long)m->OrderReferenceNumber[lVar5 + -1] + lVar8 * 10 + -0x30;
  }
LAB_001189f2:
  lVar7 = 0;
  lVar5 = 0;
  while (m->Price[lVar5] == ' ') {
    lVar5 = lVar5 + 1;
    if (lVar5 == 10) goto LAB_00118a07;
  }
  lVar7 = 0;
  for (; lVar5 != 10; lVar5 = lVar5 + 1) {
    lVar7 = (long)m->Price[lVar5] + lVar7 * 10 + -0x30;
  }
LAB_00118a07:
  uVar6 = 0;
  lVar5 = 0;
  do {
    if (m->Quantity[lVar5] != ' ') {
      if (lVar5 == 9) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar6 = ((long)m->Quantity[lVar5] + uVar6 * 10) - 0x30;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 9);
        uVar6 = uVar6 & 0xffffffff;
      }
      break;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  sVar2 = itch_side(m->BuySellIndicator);
  auVar1._25_7_ = uStack_87;
  auVar1[0x18] = sVar2;
  auVar1._8_8_ = lVar7;
  auVar1._0_8_ = lVar8;
  auVar1._16_8_ = uVar6;
  auVar1._32_8_ = this->time_sec * 1000 + this->time_msec;
  auVar1._40_8_ = 0;
  order_book::add(this_00,(order)(auVar1 << 0x40));
  local_70._0_8_ = lVar8;
  local_70._8_8_ = this_00;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long_const,helix::order_book&>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book&>,std::allocator<std::pair<unsigned_long_const,helix::order_book&>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->order_id_map);
  timestamp = this->time_sec * 1000 + this->time_msec;
  *(uint64_t *)
   ((long)iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false>.
          _M_cur + 0x30) = timestamp;
  make_ob_event((event *)local_70,(string *)this_00,timestamp,this_00,0);
  if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar4 = std::__throw_bad_function_call();
    if ((order_book *)local_70._8_8_ != (order_book *)(local_70 + 0x18)) {
      operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
    }
    _Unwind_Resume(uVar4);
  }
  (*(this->_process_event)._M_invoker)((_Any_data *)&this->_process_event,(event *)local_70);
  if ((order_book *)local_70._8_8_ == (order_book *)(local_70 + 0x18)) {
    return;
  }
  operator_delete((void *)local_70._8_8_,local_70._24_8_ + 1);
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_add_order_mpid* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
        uint64_t price    = itch_uatoi(m->Price, sizeof(m->Price));;
        uint32_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));;
        auto     side     = itch_side(m->BuySellIndicator);

        order o{order_id, price, quantity, side, timestamp()};
        ob.add(std::move(o));

        order_id_map.insert({order_id, ob});
        ob.set_timestamp(timestamp());
        _process_event(make_ob_event(ob.symbol(), timestamp(), &ob));
    }
}